

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

string * SpellSerialize(string *__return_storage_ptr__,
                       list<Character_Spell,_std::allocator<Character_Spell>_> *list)

{
  byte bVar1;
  int subject;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  _List_node_base *p_Var2;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = (_List_node_base *)list;
  while (p_Var2 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)list) {
    bVar1 = *(undefined1 *)((long)&p_Var2[1]._M_next + 2);
    util::to_string_abi_cxx11_
              (&local_58,(util *)(ulong)(uint)(int)*(short *)&p_Var2[1]._M_next,(int)in_RDX);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    util::to_string_abi_cxx11_(&local_58,(util *)(ulong)bVar1,subject);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    in_RDX = extraout_RDX;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpellSerialize(const std::list<Character_Spell> &list)
{
	std::string serialized;

	UTIL_FOREACH(list, spell)
	{
		serialized.append(util::to_string(spell.id));
		serialized.append(",");
		serialized.append(util::to_string(spell.level));
		serialized.append(";");
	}

	return serialized;
}